

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void SetTexture(side_t *side,int position,DWORD *blend,char *name)

{
  DWORD DVar1;
  FTextureID FVar2;
  ulong uVar3;
  char *stop;
  char name2 [9];
  
  DVar1 = R_ColormapNumForName(name);
  *blend = DVar1;
  FVar2.texnum = 0;
  if (DVar1 == 0) {
    FVar2 = FTextureManager::CheckForTexture(&TexMan,name,1,3);
    if (FVar2.texnum < 0) {
      strncpy(name2,name,8);
      name2[8] = '\0';
      uVar3 = strtoul(name2,&stop,0x10);
      *blend = (DWORD)uVar3;
      FVar2.texnum = 0;
    }
    else {
      *blend = 0;
    }
  }
  side->textures[position].texture.texnum = FVar2.texnum;
  return;
}

Assistant:

static void SetTexture (side_t *side, int position, DWORD *blend, const char *name)
{
	FTextureID texture;
	if ((*blend = R_ColormapNumForName (name)) == 0)
	{
		texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);
		if (!texture.Exists())
		{
			char name2[9];
			char *stop;
			strncpy (name2, name, 8);
			name2[8] = 0;
			*blend = strtoul (name2, &stop, 16);
			texture = FNullTextureID();
		}
		else
		{
			*blend = 0;
		}
	}
	else
	{
		texture = FNullTextureID();
	}
	side->SetTexture(position, texture);
}